

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

void __thiscall
ccs::Node::getChildren(Node *this,Key *key,Specificity *spec,SearchState *searchState)

{
  bool bVar1;
  pointer ppVar2;
  element_type *this_00;
  Specificity *that;
  Specificity local_84 [2];
  Key local_70;
  _Self local_38;
  _Self local_30;
  const_iterator it;
  SearchState *searchState_local;
  Specificity *spec_local;
  Key *key_local;
  Node *this_local;
  
  it._M_node = (_Base_ptr)searchState;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<ccs::Key,_std::shared_ptr<ccs::Node>,_std::less<ccs::Key>,_std::allocator<std::pair<const_ccs::Key,_std::shared_ptr<ccs::Node>_>_>_>
       ::cbegin(&this->children);
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<ccs::Key,_std::shared_ptr<ccs::Node>,_std::less<ccs::Key>,_std::allocator<std::pair<const_ccs::Key,_std::shared_ptr<ccs::Node>_>_>_>
         ::cend(&this->children);
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_ccs::Key,_std::shared_ptr<ccs::Node>_>_>::
             operator->(&local_30);
    Key::Key(&local_70,key);
    bVar1 = Key::matches(&ppVar2->first,&local_70);
    Key::~Key(&local_70);
    if (bVar1) {
      ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_ccs::Key,_std::shared_ptr<ccs::Node>_>_>
               ::operator->(&local_30);
      this_00 = std::__shared_ptr_access<ccs::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<ccs::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&ppVar2->second);
      ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_ccs::Key,_std::shared_ptr<ccs::Node>_>_>
               ::operator->(&local_30);
      that = Key::specificity(&ppVar2->first);
      local_84[0] = Specificity::operator+(spec,that);
      activate(this_00,local_84,(SearchState *)it._M_node);
    }
    std::_Rb_tree_const_iterator<std::pair<const_ccs::Key,_std::shared_ptr<ccs::Node>_>_>::
    operator++(&local_30);
  }
  return;
}

Assistant:

void getChildren(const Key &key, const Specificity &spec,
      SearchState &searchState) const {
    for (auto it = children.cbegin(); it != children.cend(); ++it) {
      if (it->first.matches(key))
        it->second->activate(spec + it->first.specificity(), searchState);
    }
  }